

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::Cord::CopyToArraySlowPath(Cord *this,Nonnull<char_*> dst)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Dd;
  string_view fragment;
  ChunkIterator __begin1;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  ChunkIterator local_b8;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    __assert_fail("contents_.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x433,"void absl::Cord::CopyToArraySlowPath(absl::Nonnull<char *>) const");
  }
  local_c8._M_len = 0;
  local_c8._M_str = (char *)0x0;
  bVar4 = GetFlatAux((this->contents_).data_.rep_.field_0.as_tree.rep,&local_c8);
  if (bVar4) {
    memcpy(dst,local_c8._M_str,local_c8._M_len);
    return;
  }
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  local_b8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  local_b8.bytes_remaining_ = 0;
  local_b8.current_chunk_ = (string_view)ZEXT816(0);
  local_b8.btree_reader_.remaining_ = 0;
  local_b8.btree_reader_.navigator_.height_ = -1;
  bVar1 = (this->contents_).data_.rep_.field_0.data[0];
  tree = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) == 0) {
      local_b8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
      local_b8.current_chunk_._M_str = (char *)((long)&(this->contents_).data_.rep_.field_0 + 1);
      local_b8.current_chunk_._M_len = local_b8.bytes_remaining_;
      goto LAB_00132a14;
    }
    CopyToArraySlowPath();
    uVar6 = extraout_XMM0_Da;
    uVar7 = extraout_XMM0_Db;
    uVar8 = extraout_XMM0_Dc;
    uVar9 = extraout_XMM0_Dd;
  }
  else {
    local_b8.bytes_remaining_ = tree->length;
    if (local_b8.bytes_remaining_ != 0) {
      ChunkIterator::InitTree(&local_b8,tree);
      goto LAB_00132a14;
    }
  }
  local_b8.current_chunk_._M_len._4_4_ = uVar7;
  local_b8.current_chunk_._M_len._0_4_ = uVar6;
  local_b8.current_chunk_._M_str._0_4_ = uVar8;
  local_b8.current_chunk_._M_str._4_4_ = uVar9;
LAB_00132a14:
  if (local_b8.bytes_remaining_ != 0) {
    do {
      sVar3 = local_b8.bytes_remaining_;
      sVar2 = local_b8.current_chunk_._M_len;
      memcpy(dst,local_b8.current_chunk_._M_str,local_b8.current_chunk_._M_len);
      dst = dst + sVar2;
      uVar5 = sVar3 - sVar2;
      if (sVar3 < sVar2) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x5fa,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      local_b8.bytes_remaining_ = uVar5;
      if (uVar5 != 0) {
        if (((long)local_b8.btree_reader_.navigator_.height_ < 0) ||
           (local_b8.btree_reader_.navigator_.node_[local_b8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if (sVar2 == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.h"
                          ,0x600,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_b8.current_chunk_ = (string_view)ZEXT816(0);
        }
        else {
          local_b8.current_chunk_ = cord_internal::CordRepBtreeReader::Next(&local_b8.btree_reader_)
          ;
        }
      }
    } while (local_b8.bytes_remaining_ != 0);
  }
  return;
}

Assistant:

void Cord::CopyToArraySlowPath(absl::Nonnull<char*> dst) const {
  assert(contents_.is_tree());
  absl::string_view fragment;
  if (GetFlatAux(contents_.tree(), &fragment)) {
    memcpy(dst, fragment.data(), fragment.size());
    return;
  }
  for (absl::string_view chunk : Chunks()) {
    memcpy(dst, chunk.data(), chunk.size());
    dst += chunk.size();
  }
}